

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O3

int __thiscall jrtplib::RTPTCPTransmitter::AddDestination(RTPTCPTransmitter *this,RTPAddress *addr)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  SocketType s;
  int local_2c;
  SocketData local_28;
  
  iVar2 = -0xb5;
  if (((this->m_init == true) && (iVar2 = -0xbb, this->m_created == true)) &&
     (iVar2 = -0xbc, addr->addresstype == TCPAddress)) {
    local_2c = *(int *)&addr->field_0xc;
    if (local_2c == 0) {
      iVar2 = -0xbd;
    }
    else {
      p_Var3 = (this->m_destSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var3 != (_Base_ptr)0x0) {
        p_Var1 = &(this->m_destSockets)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = &p_Var1->_M_header;
        do {
          if (local_2c <= (int)p_Var3[1]._M_color) {
            p_Var5 = p_Var3;
          }
          p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < local_2c];
        } while (p_Var3 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var5 != p_Var1) && ((int)p_Var5[1]._M_color <= local_2c)) {
          return -0xc2;
        }
      }
      SocketData::SocketData(&local_28);
      pmVar4 = std::
               map<int,_jrtplib::RTPTCPTransmitter::SocketData,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
               ::operator[](&this->m_destSockets,&local_2c);
      pmVar4->m_pDataBuffer = local_28.m_pDataBuffer;
      pmVar4->m_lengthBuffer[0] = local_28.m_lengthBuffer[0];
      pmVar4->m_lengthBuffer[1] = local_28.m_lengthBuffer[1];
      *(undefined2 *)&pmVar4->field_0x2 = local_28._2_2_;
      pmVar4->m_lengthBufferOffset = local_28.m_lengthBufferOffset;
      pmVar4->m_dataLength = local_28.m_dataLength;
      pmVar4->m_dataBufferOffset = local_28.m_dataBufferOffset;
      SocketData::~SocketData(&local_28);
      RTPAbortDescriptors::SendAbortSignal(this->m_pAbortDesc);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int RTPTCPTransmitter::AddDestination(const RTPAddress &addr)
{
	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;
	
	MAINMUTEX_LOCK

	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTCREATED;
	}

	if (addr.GetAddressType() != RTPAddress::TCPAddress)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_INVALIDADDRESSTYPE;
	}

	const RTPTCPAddress &a = static_cast<const RTPTCPAddress &>(addr);
	SocketType s = a.GetSocket();
	if (s == 0)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOSOCKETSPECIFIED;
	}

	int status = ValidateSocket(s);
	if (status != 0)
	{
		MAINMUTEX_UNLOCK
		return status;
	}
	
	std::map<SocketType, SocketData>::iterator it = m_destSockets.find(s);
	if (it != m_destSockets.end())
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_SOCKETALREADYINDESTINATIONS;
	}
	m_destSockets[s] = SocketData();

	// Because the sockets are also used for incoming data, we'll abort a wait
	// that may be in progress, otherwise it could take a few seconds until the
	// new socket is monitored for incoming data
	m_pAbortDesc->SendAbortSignal();

	MAINMUTEX_UNLOCK
	return 0;
}